

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

CPubKey * __thiscall
wallet::LegacyScriptPubKeyMan::GenerateNewKey
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CHDChain *hd_chain,bool internal)

{
  WalletStorage *pWVar1;
  byte bVar2;
  byte bVar3;
  undefined1 uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  CHDChain *hd_chain_00;
  runtime_error *this_00;
  CKeyMetadata *in_RCX;
  LegacyScriptPubKeyMan *in_RDX;
  LegacyScriptPubKeyMan *in_RSI;
  CPubKey *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  int64_t nCreationTime;
  bool fCompressed;
  CKey secret;
  CKeyMetadata metadata;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  LegacyScriptPubKeyMan *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  CKey *in_stack_fffffffffffffe90;
  CKeyMetadata *in_stack_fffffffffffffe98;
  undefined6 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea6;
  byte in_stack_fffffffffffffea7;
  LegacyScriptPubKeyMan *in_stack_fffffffffffffea8;
  CKeyMetadata *in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffeef;
  undefined6 in_stack_fffffffffffffef8;
  CKeyMetadata *pCVar8;
  LegacyScriptPubKeyMan *pLVar9;
  LegacyScriptPubKeyMan *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e1;
  string local_b0 [168];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_R8B & 1;
  pWVar1 = (in_RSI->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  this_01 = in_RSI;
  iVar6 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x100000000);
  if ((((byte)iVar6 ^ 0xff) & 1) == 0) {
    __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x43d,
                  "CPubKey wallet::LegacyScriptPubKeyMan::GenerateNewKey(WalletBatch &, CHDChain &, bool)"
                 );
  }
  pWVar1 = (in_RSI->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  iVar6 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x200000000);
  if ((((byte)iVar6 ^ 0xff) & 1) != 0) {
    AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
              ((char *)in_stack_fffffffffffffe78,
               (char *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe6c,(AnnotatedMixin<std::recursive_mutex> *)0x3f9d1a);
    pWVar1 = (in_RSI->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    iVar6 = (*pWVar1->_vptr_WalletStorage[6])(pWVar1,60000);
    bVar3 = (byte)iVar6;
    CKey::CKey((CKey *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    hd_chain_00 = (CHDChain *)GetTime();
    CKeyMetadata::CKeyMetadata(in_stack_fffffffffffffe98,(int64_t)in_stack_fffffffffffffe90);
    uVar7 = (*(in_RSI->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xc])();
    uVar4 = (undefined1)uVar7;
    pCVar8 = in_RCX;
    pLVar9 = in_RDX;
    if ((uVar7 & 1) == 0) {
      CKey::MakeNewKey((CKey *)in_stack_fffffffffffffe78,(bool)in_stack_fffffffffffffe77);
      in_RDX = in_stack_fffffffffffffea8;
      in_RCX = in_stack_fffffffffffffeb0;
    }
    else {
      pWVar1 = (in_RSI->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      uVar7 = (*pWVar1->_vptr_WalletStorage[6])(pWVar1,0x2227c);
      in_stack_fffffffffffffebe = (undefined1)uVar7;
      in_stack_fffffffffffffea7 = bVar2;
      if ((uVar7 & 1) == 0) {
        in_stack_fffffffffffffea7 = 0;
      }
      DeriveNewChildKey(this_01,(WalletBatch *)pLVar9,pCVar8,
                        (CKey *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_fffffffffffffef8)),
                        hd_chain_00,(bool)in_stack_fffffffffffffeef);
    }
    if ((bVar3 & 1) != 0) {
      pWVar1 = (in_RSI->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      (*pWVar1->_vptr_WalletStorage[7])(pWVar1,60000,0);
    }
    CKey::GetPubKey(in_stack_fffffffffffffe90);
    bVar5 = CKey::VerifyPubKey((CKey *)in_RDX,
                               (CPubKey *)
                               CONCAT17(in_stack_fffffffffffffea7,
                                        CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0
                                                )));
    if (bVar5) {
      CPubKey::GetID((CPubKey *)in_stack_fffffffffffffe90);
      std::
      map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
      ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                    *)in_stack_fffffffffffffe90,
                   (key_type *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
      CKeyMetadata::operator=
                ((CKeyMetadata *)in_stack_fffffffffffffe78,
                 (CKeyMetadata *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
      UpdateTimeFirstKey(in_stack_fffffffffffffe78,
                         CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
      bVar5 = AddKeyPubKeyWithDB(pLVar9,(WalletBatch *)pCVar8,
                                 (CKey *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_fffffffffffffef8)),
                                 (CPubKey *)hd_chain_00);
      if (bVar5) {
        CKeyMetadata::~CKeyMetadata
                  ((CKeyMetadata *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        CKey::~CKey((CKey *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          return in_RDI;
        }
      }
      else {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        __lhs = &local_e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8)),
                   (char *)in_RCX,(allocator<char> *)in_RDX);
        std::operator+(__lhs,(char *)this_00);
        std::runtime_error::runtime_error(this_00,local_b0);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      __stack_chk_fail();
    }
    __assert_fail("secret.VerifyPubKey(pubkey)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x455,
                  "CPubKey wallet::LegacyScriptPubKeyMan::GenerateNewKey(WalletBatch &, CHDChain &, bool)"
                 );
  }
  __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                ,0x43e,
                "CPubKey wallet::LegacyScriptPubKeyMan::GenerateNewKey(WalletBatch &, CHDChain &, bool)"
               );
}

Assistant:

CPubKey LegacyScriptPubKeyMan::GenerateNewKey(WalletBatch &batch, CHDChain& hd_chain, bool internal)
{
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET));
    AssertLockHeld(cs_KeyStore);
    bool fCompressed = m_storage.CanSupportFeature(FEATURE_COMPRPUBKEY); // default to compressed public keys if we want 0.6.0 wallets

    CKey secret;

    // Create new metadata
    int64_t nCreationTime = GetTime();
    CKeyMetadata metadata(nCreationTime);

    // use HD key derivation if HD was enabled during wallet creation and a seed is present
    if (IsHDEnabled()) {
        DeriveNewChildKey(batch, metadata, secret, hd_chain, (m_storage.CanSupportFeature(FEATURE_HD_SPLIT) ? internal : false));
    } else {
        secret.MakeNewKey(fCompressed);
    }

    // Compressed public keys were introduced in version 0.6.0
    if (fCompressed) {
        m_storage.SetMinVersion(FEATURE_COMPRPUBKEY);
    }

    CPubKey pubkey = secret.GetPubKey();
    assert(secret.VerifyPubKey(pubkey));

    mapKeyMetadata[pubkey.GetID()] = metadata;
    UpdateTimeFirstKey(nCreationTime);

    if (!AddKeyPubKeyWithDB(batch, secret, pubkey)) {
        throw std::runtime_error(std::string(__func__) + ": AddKey failed");
    }
    return pubkey;
}